

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O0

void __thiscall libtorrent::http_stream::handshake1(http_stream *this,error_code *e,handler_type *h)

{
  bool bVar1;
  http_stream *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  mutable_buffer local_30;
  handler_type *local_20;
  handler_type *h_local;
  error_code *e_local;
  http_stream *this_local;
  
  local_20 = h;
  h_local = (handler_type *)e;
  e_local = (error_code *)this;
  bVar1 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar1) {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,1);
    local_30 = (mutable_buffer)boost::asio::buffer<char,std::allocator<char>>(&this->m_buffer);
    local_78 = handshake2;
    local_70 = 0;
    local_80 = this;
    std::
    bind<void(libtorrent::http_stream::*)(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&),libtorrent::http_stream*,std::_Placeholder<1>const&,std::function<void(boost::system::error_code_const&)>>
              (&local_68,(offset_in_http_stream_to_subr *)&local_78,&local_80,
               (_Placeholder<1> *)&std::placeholders::_1,local_20);
    boost::asio::
    async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
              ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)this,(mutable_buffers_1 *)&local_30,&local_68,(type *)0x0);
    std::
    _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
    ::~_Bind(&local_68);
  }
  return;
}

Assistant:

void http_stream::handshake1(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		// read one byte from the socket
		m_buffer.resize(1);
		async_read(m_sock, boost::asio::buffer(m_buffer)
			, std::bind(&http_stream::handshake2, this, _1, std::move(h)));
	}